

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

void __thiscall
crnlib::Resampler::Resampler
          (Resampler *this,int src_x,int src_y,int dst_x,int dst_y,Boundary_Op boundary_op,
          Resample_Real sample_low,Resample_Real sample_high,char *Pfilter_name,
          Contrib_List *Pclist_x,Contrib_List *Pclist_y,Resample_Real filter_x_scale,
          Resample_Real filter_y_scale,Resample_Real src_x_ofs,Resample_Real src_y_ofs)

{
  Resample_Real filter_support;
  _func_Resample_Real_Resample_Real *Pfilter;
  int iVar1;
  int iVar2;
  int iVar3;
  Sample *pSVar4;
  Contrib_List *pCVar5;
  int *piVar6;
  uchar *puVar7;
  Scan_Buf *pSVar8;
  int yx_ops;
  int xy_ops;
  int y_ops;
  int x_ops;
  _func_Resample_Real_Resample_Real *func;
  Resample_Real support;
  int j;
  int i;
  Resample_Real src_y_ofs_local;
  Resample_Real src_x_ofs_local;
  Resample_Real filter_y_scale_local;
  Resample_Real filter_x_scale_local;
  Resample_Real sample_high_local;
  Resample_Real sample_low_local;
  Boundary_Op boundary_op_local;
  int dst_y_local;
  int dst_x_local;
  int src_y_local;
  int src_x_local;
  Resampler *this_local;
  
  this->m_lo = sample_low;
  this->m_hi = sample_high;
  this->m_delay_x_resample = false;
  this->m_intermediate_x = 0;
  this->m_Pdst_buf = (Sample *)0x0;
  this->m_Ptmp_buf = (Sample *)0x0;
  this->m_clist_x_forced = false;
  this->m_Pclist_x = (Contrib_List *)0x0;
  this->m_clist_y_forced = false;
  this->m_Pclist_y = (Contrib_List *)0x0;
  this->m_Psrc_y_count = (int *)0x0;
  this->m_Psrc_y_flag = (uchar *)0x0;
  this->m_Pscan_buf = (Scan_Buf *)0x0;
  this->m_status = STATUS_OKAY;
  this->m_resample_src_x = src_x;
  this->m_resample_src_y = src_y;
  this->m_resample_dst_x = dst_x;
  this->m_resample_dst_y = dst_y;
  this->m_boundary_op = boundary_op;
  pSVar4 = (Sample *)crnlib_malloc((long)this->m_resample_dst_x << 2);
  this->m_Pdst_buf = pSVar4;
  if (pSVar4 == (Sample *)0x0) {
    this->m_status = STATUS_OUT_OF_MEMORY;
  }
  else {
    if (Pfilter_name == (char *)0x0) {
      Pfilter_name = "lanczos4";
    }
    support = 0.0;
    while (((int)support < 0x10 &&
           (iVar1 = strcmp(Pfilter_name,&g_resample_filters + (long)(int)support * 0x30), iVar1 != 0
           ))) {
      support = (Resample_Real)((int)support + 1);
    }
    if (support == 2.24208e-44) {
      this->m_status = STATUS_BAD_FILTER_NAME;
    }
    else {
      Pfilter = *(_func_Resample_Real_Resample_Real **)(&DAT_00269ac0 + (long)(int)support * 0x30);
      filter_support = *(Resample_Real *)(&DAT_00269ac8 + (long)(int)support * 0x30);
      if (Pclist_x == (Contrib_List *)0x0) {
        pCVar5 = make_clist(this->m_resample_src_x,this->m_resample_dst_x,this->m_boundary_op,
                            Pfilter,filter_support,filter_x_scale,src_x_ofs);
        this->m_Pclist_x = pCVar5;
        if (this->m_Pclist_x == (Contrib_List *)0x0) {
          this->m_status = STATUS_OUT_OF_MEMORY;
          return;
        }
      }
      else {
        this->m_Pclist_x = Pclist_x;
        this->m_clist_x_forced = true;
      }
      if (Pclist_y == (Contrib_List *)0x0) {
        pCVar5 = make_clist(this->m_resample_src_y,this->m_resample_dst_y,this->m_boundary_op,
                            Pfilter,filter_support,filter_y_scale,src_y_ofs);
        this->m_Pclist_y = pCVar5;
        if (this->m_Pclist_y == (Contrib_List *)0x0) {
          this->m_status = STATUS_OUT_OF_MEMORY;
          return;
        }
      }
      else {
        this->m_Pclist_y = Pclist_y;
        this->m_clist_y_forced = true;
      }
      piVar6 = (int *)crnlib_calloc((long)this->m_resample_src_y,4,(size_t *)0x0);
      this->m_Psrc_y_count = piVar6;
      if (piVar6 == (int *)0x0) {
        this->m_status = STATUS_OUT_OF_MEMORY;
      }
      else {
        puVar7 = (uchar *)crnlib_calloc((long)this->m_resample_src_y,1,(size_t *)0x0);
        this->m_Psrc_y_flag = puVar7;
        if (puVar7 == (uchar *)0x0) {
          this->m_status = STATUS_OUT_OF_MEMORY;
        }
        else {
          for (support = 0.0; (int)support < this->m_resample_dst_y;
              support = (Resample_Real)((int)support + 1)) {
            for (func._4_4_ = 0; func._4_4_ < (int)(uint)this->m_Pclist_y[(int)support].n;
                func._4_4_ = func._4_4_ + 1) {
              piVar6 = this->m_Psrc_y_count;
              iVar1 = resampler_range_check
                                ((uint)this->m_Pclist_y[(int)support].p[func._4_4_].pixel,
                                 this->m_resample_src_y);
              piVar6[iVar1] = piVar6[iVar1] + 1;
            }
          }
          pSVar8 = (Scan_Buf *)crnlib_malloc(0x30000);
          this->m_Pscan_buf = pSVar8;
          if (pSVar8 == (Scan_Buf *)0x0) {
            this->m_status = STATUS_OUT_OF_MEMORY;
          }
          else {
            for (support = 0.0; (int)support < 0x4000; support = (Resample_Real)((int)support + 1))
            {
              this->m_Pscan_buf->scan_buf_y[(int)support] = -1;
              this->m_Pscan_buf->scan_buf_l[(int)support] = (Sample *)0x0;
            }
            this->m_cur_dst_y = 0;
            this->m_cur_src_y = 0;
            iVar1 = count_ops(this,this->m_Pclist_x,this->m_resample_dst_x);
            iVar2 = count_ops(this,this->m_Pclist_y,this->m_resample_dst_y);
            iVar3 = iVar1 * this->m_resample_src_y + (iVar2 * 4 * this->m_resample_dst_x) / 3;
            iVar1 = (iVar2 * 4 * this->m_resample_src_x) / 3 + iVar1 * this->m_resample_dst_y;
            if ((iVar1 < iVar3) ||
               ((iVar3 == iVar1 && (this->m_resample_src_x < this->m_resample_dst_x)))) {
              this->m_delay_x_resample = true;
              this->m_intermediate_x = this->m_resample_src_x;
            }
            else {
              this->m_delay_x_resample = false;
              this->m_intermediate_x = this->m_resample_dst_x;
            }
            if ((this->m_delay_x_resample & 1U) != 0) {
              pSVar4 = (Sample *)crnlib_malloc((long)this->m_intermediate_x << 2);
              this->m_Ptmp_buf = pSVar4;
              if (pSVar4 == (Sample *)0x0) {
                this->m_status = STATUS_OUT_OF_MEMORY;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

Resampler::Resampler(int src_x, int src_y,
        int dst_x, int dst_y,
        Boundary_Op boundary_op,
        Resample_Real sample_low, Resample_Real sample_high,
        const char* Pfilter_name,
        Contrib_List* Pclist_x,
        Contrib_List* Pclist_y,
        Resample_Real filter_x_scale,
        Resample_Real filter_y_scale,
        Resample_Real src_x_ofs,
        Resample_Real src_y_ofs)
    {
        int i, j;
        Resample_Real support, (*func)(Resample_Real);

        resampler_assert(src_x > 0);
        resampler_assert(src_y > 0);
        resampler_assert(dst_x > 0);
        resampler_assert(dst_y > 0);

#if CRNLIB_RESAMPLER_DEBUG_OPS
        total_ops = 0;
#endif

        m_lo = sample_low;
        m_hi = sample_high;

        m_delay_x_resample = false;
        m_intermediate_x = 0;
        m_Pdst_buf = nullptr;
        m_Ptmp_buf = nullptr;
        m_clist_x_forced = false;
        m_Pclist_x = nullptr;
        m_clist_y_forced = false;
        m_Pclist_y = nullptr;
        m_Psrc_y_count = nullptr;
        m_Psrc_y_flag = nullptr;
        m_Pscan_buf = nullptr;
        m_status = STATUS_OKAY;

        m_resample_src_x = src_x;
        m_resample_src_y = src_y;
        m_resample_dst_x = dst_x;
        m_resample_dst_y = dst_y;

        m_boundary_op = boundary_op;

        if ((m_Pdst_buf = (Sample*)crnlib_malloc(m_resample_dst_x * sizeof(Sample))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        // Find the specified filter.

        if (Pfilter_name == nullptr)
        {
            Pfilter_name = CRNLIB_RESAMPLER_DEFAULT_FILTER;
        }

        for (i = 0; i < g_num_resample_filters; i++)
        {
            if (strcmp(Pfilter_name, g_resample_filters[i].name) == 0)
            {
                break;
            }
        }

        if (i == g_num_resample_filters)
        {
            m_status = STATUS_BAD_FILTER_NAME;
            return;
        }

        func = g_resample_filters[i].func;
        support = g_resample_filters[i].support;

        /* Create contributor lists, unless the user supplied custom lists. */

        if (!Pclist_x)
        {
            m_Pclist_x = make_clist(m_resample_src_x, m_resample_dst_x, m_boundary_op, func, support, filter_x_scale, src_x_ofs);
            if (!m_Pclist_x)
            {
                m_status = STATUS_OUT_OF_MEMORY;
                return;
            }
        }
        else
        {
            m_Pclist_x = Pclist_x;
            m_clist_x_forced = true;
        }

        if (!Pclist_y)
        {
            m_Pclist_y = make_clist(m_resample_src_y, m_resample_dst_y, m_boundary_op, func, support, filter_y_scale, src_y_ofs);
            if (!m_Pclist_y)
            {
                m_status = STATUS_OUT_OF_MEMORY;
                return;
            }
        }
        else
        {
            m_Pclist_y = Pclist_y;
            m_clist_y_forced = true;
        }

        if ((m_Psrc_y_count = (int*)crnlib_calloc(m_resample_src_y, sizeof(int))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        if ((m_Psrc_y_flag = (unsigned char*)crnlib_calloc(m_resample_src_y, sizeof(unsigned char))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        /* Count how many times each source line
      * contributes to a destination line.
      */

        for (i = 0; i < m_resample_dst_y; i++)
        {
            for (j = 0; j < m_Pclist_y[i].n; j++)
            {
                m_Psrc_y_count[resampler_range_check(m_Pclist_y[i].p[j].pixel, m_resample_src_y)]++;
            }
        }

        if ((m_Pscan_buf = (Scan_Buf*)crnlib_malloc(sizeof(Scan_Buf))) == nullptr)
        {
            m_status = STATUS_OUT_OF_MEMORY;
            return;
        }

        for (i = 0; i < MAX_SCAN_BUF_SIZE; i++)
        {
            m_Pscan_buf->scan_buf_y[i] = -1;
            m_Pscan_buf->scan_buf_l[i] = nullptr;
        }

        m_cur_src_y = m_cur_dst_y = 0;
        {
            // Determine which axis to resample first by comparing the number of multiplies required
            // for each possibility.
            int x_ops = count_ops(m_Pclist_x, m_resample_dst_x);
            int y_ops = count_ops(m_Pclist_y, m_resample_dst_y);

            // Hack 10/2000: Weight Y axis ops a little more than X axis ops.
            // (Y axis ops use more cache resources.)
            int xy_ops = x_ops * m_resample_src_y +
                (4 * y_ops * m_resample_dst_x) / 3;

            int yx_ops = (4 * y_ops * m_resample_src_x) / 3 +
                x_ops * m_resample_dst_y;

#if CRNLIB_RESAMPLER_DEBUG_OPS
            printf("src: %i %i\n", m_resample_src_x, m_resample_src_y);
            printf("dst: %i %i\n", m_resample_dst_x, m_resample_dst_y);
            printf("x_ops: %i\n", x_ops);
            printf("y_ops: %i\n", y_ops);
            printf("xy_ops: %i\n", xy_ops);
            printf("yx_ops: %i\n", yx_ops);
#endif

            // Now check which resample order is better. In case of a tie, choose the order
            // which buffers the least amount of data.
            if ((xy_ops > yx_ops) ||
                ((xy_ops == yx_ops) && (m_resample_src_x < m_resample_dst_x)))
            {
                m_delay_x_resample = true;
                m_intermediate_x = m_resample_src_x;
            }
            else
            {
                m_delay_x_resample = false;
                m_intermediate_x = m_resample_dst_x;
            }
#if CRNLIB_RESAMPLER_DEBUG_OPS
            printf("delaying: %i\n", m_delay_x_resample);
#endif
        }

        if (m_delay_x_resample)
        {
            if ((m_Ptmp_buf = (Sample*)crnlib_malloc(m_intermediate_x * sizeof(Sample))) == nullptr)
            {
                m_status = STATUS_OUT_OF_MEMORY;
                return;
            }
        }
    }